

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

CService * MaybeFlipIPv6toCJDNS(CService *__return_storage_ptr__,CService *service)

{
  undefined4 uVar1;
  long lVar2;
  undefined4 uVar3;
  bool bVar4;
  CService *pCVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)__return_storage_ptr__,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)service);
  uVar1 = (service->super_CNetAddr).m_net;
  uVar3 = (service->super_CNetAddr).m_scope_id;
  (__return_storage_ptr__->super_CNetAddr).m_net = uVar1;
  (__return_storage_ptr__->super_CNetAddr).m_scope_id = uVar3;
  __return_storage_ptr__->port = service->port;
  if (uVar1 == 2) {
    pCVar5 = __return_storage_ptr__;
    if (0x10 < (__return_storage_ptr__->super_CNetAddr).m_addr._size) {
      pCVar5 = (CService *)
               (__return_storage_ptr__->super_CNetAddr).m_addr._union.indirect_contents.indirect;
    }
    if ((pCVar5->super_CNetAddr).m_addr._union.direct[0] == -4) {
      bVar4 = ReachableNets::Contains(&g_reachable_nets,NET_CJDNS);
      if (bVar4) {
        (__return_storage_ptr__->super_CNetAddr).m_net = NET_CJDNS;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CService MaybeFlipIPv6toCJDNS(const CService& service)
{
    CService ret{service};
    if (ret.IsIPv6() && ret.HasCJDNSPrefix() && g_reachable_nets.Contains(NET_CJDNS)) {
        ret.m_net = NET_CJDNS;
    }
    return ret;
}